

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

ly_set * lyd_find_path(lyd_node *ctx_node,char *path)

{
  int iVar1;
  undefined4 uVar2;
  lys_module *plVar3;
  char *pcVar4;
  ly_set *set;
  LY_ERR no;
  ly_ctx *ctx;
  lys_node *plVar5;
  ulong uVar6;
  long lVar7;
  undefined1 auStack_98 [8];
  lyxp_set xp_set;
  char *local_50;
  char *mod_name;
  char *name;
  int local_38;
  int mod_name_len;
  int name_len;
  int is_relative;
  
  mod_name_len = -1;
  if (ctx_node == (lyd_node *)0x0 || path == (char *)0x0) {
    pcVar4 = "Invalid arguments (%s()).";
    ctx = (ly_ctx *)0x0;
    no = LY_EINVAL;
  }
  else {
    iVar1 = parse_schema_nodeid(path,&local_50,(int *)((long)&name + 4),&mod_name,&local_38,
                                &mod_name_len,(int *)0x0,(int *)0x0,1);
    if (iVar1 < 1) {
      plVar5 = ctx_node->schema;
    }
    else {
      plVar5 = ctx_node->schema;
      if ((*mod_name == '#') && (mod_name_len == 0)) {
        plVar3 = plVar5->module;
        if ((plVar3->field_0x40 & 1) != 0) {
          plVar3 = (lys_module *)plVar3->data;
        }
        pcVar4 = plVar3->name;
        iVar1 = strncmp(local_50,pcVar4,(long)name._4_4_);
        if (iVar1 != 0) {
          return (ly_set *)0x0;
        }
        if (pcVar4[name._4_4_] != '\0') {
          return (ly_set *)0x0;
        }
        path = mod_name + local_38;
      }
    }
    plVar3 = plVar5->module;
    if ((plVar3->field_0x40 & 1) != 0) {
      plVar3 = (lys_module *)plVar3->data;
    }
    pcVar4 = transform_json2xpath(plVar3,path);
    if (pcVar4 == (char *)0x0) {
      return (ly_set *)0x0;
    }
    xp_set.ht = (hash_table *)0x0;
    xp_set.ctx_pos = 0;
    xp_set.ctx_size = 0;
    xp_set.val._8_8_ = 0;
    xp_set.used = 0;
    xp_set.size = 0;
    xp_set._8_8_ = 0;
    xp_set.val.nodes = (lyxp_set_node *)0x0;
    auStack_98 = (undefined1  [8])0x0;
    xp_set.type = LYXP_SET_EMPTY;
    xp_set._4_4_ = 0;
    plVar3 = ctx_node->schema->module;
    if ((plVar3->field_0x40 & 1) != 0) {
      plVar3 = (lys_module *)plVar3->data;
    }
    iVar1 = lyxp_eval(pcVar4,ctx_node,LYXP_NODE_ELEM,plVar3,(lyxp_set *)auStack_98,0);
    free(pcVar4);
    if (iVar1 != 0) {
      return (ly_set *)0x0;
    }
    set = ly_set_new();
    if (set != (ly_set *)0x0) {
      if ((auStack_98._0_4_ == LYXP_SET_NODE_SET) && (xp_set.val._8_4_ != 0)) {
        lVar7 = 8;
        uVar6 = 0;
        uVar2 = xp_set.val._8_4_;
        do {
          if (*(int *)(xp_set._8_8_ + lVar7) == 2) {
            iVar1 = ly_set_add(set,*(void **)(xp_set._8_8_ + -8 + lVar7),1);
            if (iVar1 < 0) {
              free((set->set).s);
              free(set);
              set = (ly_set *)0x0;
              break;
            }
            uVar2 = xp_set.val._8_4_;
          }
          uVar6 = uVar6 + 1;
          lVar7 = lVar7 + 0x10;
        } while (uVar6 < (uint)uVar2);
      }
      lyxp_set_cast((lyxp_set *)auStack_98,LYXP_SET_EMPTY,ctx_node,(lys_module *)0x0,0);
      return set;
    }
    ctx = ctx_node->schema->module->ctx;
    pcVar4 = "Memory allocation failed (%s()).";
    no = LY_EMEM;
  }
  ly_log(ctx,LY_LLERR,no,pcVar4,"lyd_find_path");
  return (ly_set *)0x0;
}

Assistant:

ly_set *
lyd_find_path(const struct lyd_node *ctx_node, const char *path)
{
    struct lyxp_set xp_set;
    struct ly_set *set;
    char *yang_xpath;
    const char * node_mod_name, *mod_name, *name;
    int mod_name_len, name_len, is_relative = -1;
    uint32_t i;

    if (!ctx_node || !path) {
        LOGARG;
        return NULL;
    }

    if (parse_schema_nodeid(path, &mod_name, &mod_name_len, &name, &name_len, &is_relative, NULL, NULL, 1) > 0) {
        if (name[0] == '#' && !is_relative) {
            node_mod_name = lyd_node_module(ctx_node)->name;
            if (strncmp(mod_name, node_mod_name, mod_name_len) || node_mod_name[mod_name_len]) {
                return NULL;
            }
            path = name + name_len;
        }
    }

    /* transform JSON into YANG XPATH */
    yang_xpath = transform_json2xpath(lyd_node_module(ctx_node), path);
    if (!yang_xpath) {
        return NULL;
    }

    memset(&xp_set, 0, sizeof xp_set);

    if (lyxp_eval(yang_xpath, ctx_node, LYXP_NODE_ELEM, lyd_node_module(ctx_node), &xp_set, 0) != EXIT_SUCCESS) {
        free(yang_xpath);
        return NULL;
    }
    free(yang_xpath);

    set = ly_set_new();
    LY_CHECK_ERR_RETURN(!set, LOGMEM(ctx_node->schema->module->ctx), NULL);

    if (xp_set.type == LYXP_SET_NODE_SET) {
        for (i = 0; i < xp_set.used; ++i) {
            if (xp_set.val.nodes[i].type == LYXP_NODE_ELEM) {
                if (ly_set_add(set, xp_set.val.nodes[i].node, LY_SET_OPT_USEASLIST) < 0) {
                    ly_set_free(set);
                    set = NULL;
                    break;
                }
            }
        }
    }
    /* free xp_set content */
    lyxp_set_cast(&xp_set, LYXP_SET_EMPTY, ctx_node, NULL, 0);

    return set;
}